

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signalhandler.cc
# Opt level: O1

void google::InstallFailureSignalHandler(void)

{
  int iVar1;
  ostream *poVar2;
  SendMethod in_R9;
  long lVar3;
  sigaction sig_action;
  LogMessage local_d8;
  sigaction local_c8;
  
  lVar3 = 0;
  memset(&local_c8,0,0x98);
  sigemptyset(&local_c8.sa_mask);
  local_c8.sa_flags._0_1_ = (byte)local_c8.sa_flags | 4;
  local_c8.__sigaction_handler.sa_handler = anon_unknown_0::FailureSignalHandler;
  do {
    iVar1 = sigaction(*(int *)((long)&(anonymous_namespace)::kFailureSignals + lVar3),&local_c8,
                      (sigaction *)0x0);
    if (iVar1 == -1) {
      ErrnoLogMessage::ErrnoLogMessage
                ((ErrnoLogMessage *)&local_d8,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/signalhandler.cc"
                 ,0x181,3,0,in_R9);
      poVar2 = LogMessage::stream(&local_d8);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar2,"sigaction(kFailureSignals[i].number, &sig_action, NULL)",0x37);
      ErrnoLogMessage::~ErrnoLogMessage((ErrnoLogMessage *)&local_d8);
    }
    lVar3 = lVar3 + 0x10;
  } while (lVar3 != 0x60);
  return;
}

Assistant:

void InstallFailureSignalHandler() {
#ifdef HAVE_SIGACTION
  // Build the sigaction struct.
  struct sigaction sig_action;
  memset(&sig_action, 0, sizeof(sig_action));
  sigemptyset(&sig_action.sa_mask);
  sig_action.sa_flags |= SA_SIGINFO;
  sig_action.sa_sigaction = &FailureSignalHandler;

  for (size_t i = 0; i < ARRAYSIZE(kFailureSignals); ++i) {
    CHECK_ERR(sigaction(kFailureSignals[i].number, &sig_action, NULL));
  }
  kFailureSignalHandlerInstalled = true;
#elif defined(OS_WINDOWS)
  for (size_t i = 0; i < ARRAYSIZE(kFailureSignals); ++i) {
    CHECK_NE(signal(kFailureSignals[i].number, &FailureSignalHandler),
             SIG_ERR);
  }
  kFailureSignalHandlerInstalled = true;
#endif  // HAVE_SIGACTION
}